

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

void sat_solver_reducedb(sat_solver *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  uint nSize;
  int iVar3;
  uint uVar4;
  int *piVar5;
  veci *pvVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int **ppiVar21;
  int iVar22;
  double dVar23;
  timespec ts;
  timespec local_40;
  
  iVar7 = clock_gettime(3,&local_40);
  if (iVar7 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (s->nLearntMax < 1) {
    __assert_fail("s->nLearntMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x5fc,"void sat_solver_reducedb(sat_solver *)");
  }
  nSize = (s->act_clas).size;
  if (nSize != (s->Mem).nEntries[1]) {
    __assert_fail("nLearnedOld == Sat_MemEntryNum(pMem, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x5fd,"void sat_solver_reducedb(sat_solver *)");
  }
  if (nSize != (s->stats).learnts) {
    __assert_fail("nLearnedOld == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x5fe,"void sat_solver_reducedb(sat_solver *)");
  }
  piVar5 = (s->act_clas).ptr;
  iVar7 = s->nDBreduces + 1;
  s->nDBreduces = iVar7;
  iVar22 = iVar7 * s->nLearntDelta + s->nLearntStart;
  s->nLearntMax = iVar22;
  piVar8 = (int *)malloc((long)(int)nSize * 4);
  iVar7 = (s->Mem).iPage[1];
  if (0 < iVar7) {
    ppiVar21 = (s->Mem).pPages;
    lVar13 = 1;
    do {
      piVar9 = ppiVar21[lVar13];
      if (2 < *piVar9) {
        iVar10 = s->ClaActType;
        uVar15 = 2;
        do {
          puVar16 = (uint *)(piVar9 + uVar15);
          uVar17 = *puVar16 >> 3 & 0xff;
          if (6 < uVar17) {
            uVar17 = 7;
          }
          uVar18 = (uVar17 ^ 7) << 0x1c;
          uVar17 = puVar16[(ulong)(*puVar16 >> 0xb) + 1];
          if (iVar10 == 0) {
            iVar3 = piVar5[(int)uVar17];
            piVar8[(int)uVar17] = uVar18 | iVar3 >> 4;
            if (iVar3 >> 4 < 0) {
              __assert_fail("pSortValues[Id] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                            ,0x610,"void sat_solver_reducedb(sat_solver *)");
            }
          }
          else {
            piVar8[(int)uVar17] = uVar18;
          }
          uVar17 = (int)uVar15 + ((*puVar16 & 1) + (*puVar16 >> 0xb) + 2 & 0xfffffffe);
          uVar15 = (ulong)uVar17;
        } while ((int)uVar17 < *piVar9);
      }
      lVar13 = lVar13 + 2;
    } while ((int)lVar13 <= iVar7);
  }
  iVar7 = s->nLearntRatio;
  piVar9 = Abc_MergeSortCost(piVar8,nSize);
  if (piVar8[piVar9[(long)(int)nSize + -1]] < piVar8[*piVar9]) {
    __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x61b,"void sat_solver_reducedb(sat_solver *)");
  }
  iVar7 = (int)((ulong)((long)(int)(iVar7 * nSize) * -0x51eb851f) >> 0x20);
  iVar7 = piVar8[piVar9[(int)(((iVar7 >> 5) - (iVar7 >> 0x1f)) + nSize)]];
  free(piVar9);
  iVar10 = (s->Mem).iPage[1];
  if (iVar10 < 1) {
    uVar17 = 0;
    uVar18 = 0;
  }
  else {
    iVar22 = (int)((ulong)((long)iVar22 * -0x66666667) >> 0x20);
    ppiVar21 = (s->Mem).pPages;
    uVar18 = 0;
    lVar13 = 1;
    uVar17 = 0;
    do {
      if (2 < *ppiVar21[lVar13]) {
        if (ppiVar21[lVar13] != (int *)0x0) {
          puVar16 = (uint *)(ppiVar21[lVar13] + 2);
          uVar14 = 2;
          while( true ) {
            uVar4 = *puVar16;
            if ((uVar4 & 2) != 0) {
              __assert_fail("c->mark == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                            ,0x624,"void sat_solver_reducedb(sat_solver *)");
            }
            uVar19 = uVar4 >> 0xb;
            if (((((int)(((iVar22 >> 3) - (iVar22 >> 0x1f)) + nSize) < (int)uVar18) ||
                 (uVar4 < 0x1800)) || (iVar7 < piVar8[(int)puVar16[(ulong)uVar19 + 1]])) ||
               (s->reasons[(int)puVar16[1] >> 1] ==
                ((int)lVar13 << ((byte)(s->Mem).nPageSize & 0x1f) | uVar14))) {
              lVar20 = (long)(int)uVar17;
              uVar17 = uVar17 + 1;
              piVar5[lVar20] = piVar5[(int)puVar16[(ulong)uVar19 + 1]];
            }
            else {
              *puVar16 = uVar4 | 2;
              pAVar1 = &(s->stats).learnts_literals;
              *pAVar1 = *pAVar1 - (ulong)uVar19;
              puVar2 = &(s->stats).learnts;
              *puVar2 = *puVar2 - 1;
              ppiVar21 = (s->Mem).pPages;
            }
            uVar14 = uVar14 + ((*puVar16 & 1) + (*puVar16 >> 0xb) + 2 & 0xfffffffe);
            if (*ppiVar21[lVar13] <= (int)uVar14) break;
            puVar16 = (uint *)(ppiVar21[lVar13] + uVar14);
            uVar18 = uVar18 + 1;
          }
          uVar18 = uVar18 + 1;
        }
        iVar10 = (s->Mem).iPage[1];
      }
      lVar13 = lVar13 + 2;
    } while ((int)lVar13 <= iVar10);
  }
  if ((s->stats).learnts != uVar17) {
    __assert_fail("s->stats.learnts == (unsigned)j",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x62e,"void sat_solver_reducedb(sat_solver *)");
  }
  if (uVar18 != nSize) {
    __assert_fail("Counter == nLearnedOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x62f,"void sat_solver_reducedb(sat_solver *)");
  }
  if ((s->act_clas).size < (int)uVar17) {
LAB_005558e8:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->act_clas).size = uVar17;
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  uVar17 = Sat_MemCompactLearned(&s->Mem,0);
  if (uVar17 != (s->stats).learnts) {
    __assert_fail("Counter == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x635,"void sat_solver_reducedb(sat_solver *)");
  }
  iVar7 = s->size;
  if (0 < iVar7) {
    piVar5 = s->reasons;
    lVar13 = 0;
    do {
      uVar17 = piVar5[lVar13];
      if (((uVar17 & 1) == 0 && uVar17 != 0) && (((s->Mem).uLearnedMask & uVar17) != 0)) {
        uVar18 = (s->Mem).uPageMask & uVar17;
        if (uVar18 == 0) {
LAB_005558c9:
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                        ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
        }
        piVar8 = (s->Mem).pPages[(int)uVar17 >> ((byte)(s->Mem).nPageSize & 0x1f)];
        uVar17 = piVar8[(int)uVar18];
        if ((uVar17 & 2) != 0) {
          __assert_fail("c->mark == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                        ,0x641,"void sat_solver_reducedb(sat_solver *)");
        }
        piVar5[lVar13] = piVar8[(long)(int)uVar18 + (ulong)(uVar17 >> 0xb) + 1];
        iVar7 = s->size;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar7);
    if (0 < iVar7) {
      pvVar6 = s->wlists;
      lVar13 = 0;
      do {
        iVar7 = pvVar6[lVar13].size;
        iVar22 = 0;
        if (0 < iVar7) {
          piVar5 = pvVar6[lVar13].ptr;
          lVar20 = 0;
          iVar22 = 0;
          do {
            uVar17 = piVar5[lVar20];
            if (((uVar17 & 1) == 0) && (((s->Mem).uLearnedMask & uVar17) != 0)) {
              if (uVar17 == 0) {
                puVar16 = (uint *)0x0;
              }
              else {
                uVar18 = (s->Mem).uPageMask & uVar17;
                if (uVar18 == 0) goto LAB_005558c9;
                puVar16 = (uint *)((s->Mem).pPages[(int)uVar17 >> ((byte)(s->Mem).nPageSize & 0x1f)]
                                  + (int)uVar18);
              }
              if ((*puVar16 & 2) == 0) {
                uVar17 = puVar16[(ulong)(*puVar16 >> 0xb) + 1];
                goto LAB_00555763;
              }
            }
            else {
LAB_00555763:
              lVar11 = (long)iVar22;
              iVar22 = iVar22 + 1;
              piVar5[lVar11] = uVar17;
            }
            lVar20 = lVar20 + 1;
            iVar7 = pvVar6[lVar13].size;
          } while (lVar20 < iVar7);
        }
        if (iVar7 < iVar22) goto LAB_005558e8;
        pvVar6[lVar13].size = iVar22;
        lVar13 = lVar13 + 1;
      } while (SBORROW8(lVar13,(long)s->size * 2) != lVar13 + (long)s->size * -2 < 0);
    }
  }
  uVar17 = Sat_MemCompactLearned(&s->Mem,1);
  if (uVar17 != (s->stats).learnts) {
    __assert_fail("Counter == (int)s->stats.learnts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x65b,"void sat_solver_reducedb(sat_solver *)");
  }
  iVar22 = 3;
  iVar7 = clock_gettime(3,&local_40);
  if (iVar7 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  sat_solver_reducedb::TimeTotal = sat_solver_reducedb::TimeTotal + lVar13 + lVar12;
  if (s->fVerbose != 0) {
    Abc_Print(iVar22,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
              ((double)(s->stats).learnts * 100.0) / (double)(int)nSize);
    dVar23 = (double)sat_solver_reducedb::TimeTotal;
    Abc_Print(iVar22,"%s =","Time");
    Abc_Print(iVar22,"%9.2f sec\n",dVar23 / 1000000.0);
  }
  return;
}

Assistant:

void sat_solver_reducedb(sat_solver* s)
{
    static abctime TimeTotal = 0;
    abctime clk = Abc_Clock();
    Sat_Mem_t * pMem = &s->Mem;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pArray, * pSortValues, nCutoffValue;
    int i, k, j, Id, Counter, CounterStart, nSelected;
    clause * c;

    assert( s->nLearntMax > 0 );
    assert( nLearnedOld == Sat_MemEntryNum(pMem, 1) );
    assert( nLearnedOld == (int)s->stats.learnts );

    s->nDBreduces++;

    //printf( "Calling reduceDB with %d learned clause limit.\n", s->nLearntMax );
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
//    return;

    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
//        pSortValues[Id] = act[Id];
        if ( s->ClaActType == 0 )
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4);
        else
            pSortValues[Id] = ((7 - Abc_MinInt(c->lbd, 7)) << 28);// | (act_clas[Id] >> 4);
        assert( pSortValues[Id] >= 0 );
    }

    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);

    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;

    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    ActCutOff = ABC_INFINITY;

    // mark learned clauses to remove
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 3 || pSortValues[clause_id(c)] > nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
            act_clas[j++] = act_clas[clause_id(c)];
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    ABC_FREE( pSortValues );

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        c = clause_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                c = clause_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
    Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
        s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
    Abc_PrintTime( 1, "Time", TimeTotal );
    }
}